

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O1

void __thiscall
wasm::SmallVector<unsigned_int,_1UL>::resize(SmallVector<unsigned_int,_1UL> *this,size_t newSize)

{
  pointer puVar1;
  
  this->usedFixed = (ulong)(newSize != 0);
  if (1 < newSize) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->flexible,newSize - 1);
    return;
  }
  puVar1 = (this->flexible).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->flexible).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->flexible).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void resize(size_t newSize) {
    usedFixed = std::min(N, newSize);
    if (newSize > N) {
      flexible.resize(newSize - N);
    } else {
      flexible.clear();
    }
  }